

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasExtensionFromFile
               (Message *msg,FileDescriptor *file,Options *options,bool *has_opt_codesize_extension)

{
  FieldDescriptor *this;
  pointer ppFVar1;
  bool bVar2;
  FileOptions_OptimizeMode FVar3;
  int iVar4;
  pointer ppFVar5;
  long lVar6;
  Message *pMVar7;
  Message *extraout_RDX;
  int i;
  int iVar8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  google::protobuf::Message::GetMetadata();
  google::protobuf::Reflection::ListFields(extraout_RDX,(vector *)msg);
  ppFVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar5 = local_48._M_impl.super__Vector_impl_data._M_start; ppFVar5 != ppFVar1;
      ppFVar5 = ppFVar5 + 1) {
    this = *ppFVar5;
    lVar6 = google::protobuf::FieldDescriptor::message_type();
    if (lVar6 != 0) {
      if (((byte)this[1] & 8) != 0) {
        lVar6 = google::protobuf::FieldDescriptor::message_type();
        if (*(FileDescriptor **)(lVar6 + 0x10) == file) break;
        if ((has_opt_codesize_extension != (bool *)0x0) &&
           (FVar3 = GetOptimizeFor(*(FileDescriptor **)(lVar6 + 0x10),options),
           FVar3 == FileOptions_OptimizeMode_CODE_SIZE)) {
          *has_opt_codesize_extension = true;
        }
      }
      bVar2 = FieldDescriptor::is_repeated(this);
      if (bVar2) {
        iVar8 = 0;
        while (iVar4 = google::protobuf::Reflection::FieldSize(extraout_RDX,(FieldDescriptor *)msg),
              iVar8 < iVar4) {
          pMVar7 = (Message *)
                   google::protobuf::Reflection::GetRepeatedMessage
                             (extraout_RDX,(FieldDescriptor *)msg,(int)this);
          bVar2 = HasExtensionFromFile(pMVar7,file,options,has_opt_codesize_extension);
          iVar8 = iVar8 + 1;
          if (bVar2) goto LAB_001b41e5;
        }
      }
      else {
        pMVar7 = (Message *)
                 google::protobuf::Reflection::GetMessage
                           (extraout_RDX,(FieldDescriptor *)msg,(MessageFactory *)this);
        bVar2 = HasExtensionFromFile(pMVar7,file,options,has_opt_codesize_extension);
        if (bVar2) break;
      }
    }
  }
LAB_001b41e5:
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_48);
  return ppFVar5 != ppFVar1;
}

Assistant:

static bool HasExtensionFromFile(const Message& msg, const FileDescriptor* file,
                                 const Options& options,
                                 bool* has_opt_codesize_extension) {
  std::vector<const FieldDescriptor*> fields;
  auto reflection = msg.GetReflection();
  reflection->ListFields(msg, &fields);
  for (auto field : fields) {
    const auto* field_msg = field->message_type();
    if (field_msg == nullptr) {
      // It so happens that enums Is_Valid are still generated so enums work.
      // Only messages have potential problems.
      continue;
    }
    // If this option has an extension set AND that extension is defined in the
    // same file we have bootstrap problem.
    if (field->is_extension()) {
      const auto* msg_extension_file = field->message_type()->file();
      if (msg_extension_file == file) return true;
      if (has_opt_codesize_extension &&
          GetOptimizeFor(msg_extension_file, options) ==
              FileOptions::CODE_SIZE) {
        *has_opt_codesize_extension = true;
      }
    }
    // Recurse in this field to see if there is a problem in there
    if (field->is_repeated()) {
      for (int i = 0; i < reflection->FieldSize(msg, field); i++) {
        if (HasExtensionFromFile(reflection->GetRepeatedMessage(msg, field, i),
                                 file, options, has_opt_codesize_extension)) {
          return true;
        }
      }
    } else {
      if (HasExtensionFromFile(reflection->GetMessage(msg, field), file,
                               options, has_opt_codesize_extension)) {
        return true;
      }
    }
  }
  return false;
}